

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void processOPN(UA_Server *server,UA_Connection *connection,UA_UInt32 channelId,UA_ByteString *msg)

{
  UA_Byte **offset_00;
  UA_Byte *pUVar1;
  UA_SecureChannel *pUVar2;
  long lVar3;
  UA_SequenceHeader UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  UA_StatusCode UVar7;
  UA_StatusCode UVar8;
  int iVar9;
  int iVar10;
  undefined1 local_230 [8];
  UA_OpenSecureChannelRequest r;
  UA_OpenSecureChannelResponse p;
  UA_NodeId responseType;
  UA_SecureConversationMessageHeader respHeader;
  UA_NodeId requestType;
  size_t offset;
  UA_AsymmetricAlgorithmSecurityHeader asymHeader;
  size_t tmpPos;
  undefined1 auStack_58 [8];
  UA_ByteString resp_msg;
  UA_SequenceHeader local_40;
  UA_SequenceHeader seqHeader;
  
  iVar9 = 0;
  if (connection->state != UA_CONNECTION_ESTABLISHED) {
    iVar9 = -0x7ffb0000;
  }
  pUVar2 = connection->channel;
  iVar10 = iVar9;
  if (pUVar2 == (UA_SecureChannel *)0x0) {
    iVar10 = -0x7ffb0000;
  }
  if (channelId == 0) {
    iVar10 = iVar9;
  }
  if ((pUVar2 != (UA_SecureChannel *)0x0) &&
     (iVar10 = -0x7ffb0000, (pUVar2->securityToken).channelId == channelId)) {
    iVar10 = iVar9;
  }
  pUVar1 = requestType.identifier.guid.data4;
  requestType.identifier.string.data = (UA_Byte *)0x0;
  seqHeader = (UA_SequenceHeader)connection;
  UVar5 = UA_AsymmetricAlgorithmSecurityHeader_decodeBinary
                    (msg,(size_t *)pUVar1,(UA_AsymmetricAlgorithmSecurityHeader *)&offset);
  UVar6 = UA_SequenceHeader_decodeBinary(msg,(size_t *)pUVar1,&local_40);
  UVar7 = UA_NodeId_decodeBinary
                    (msg,(size_t *)pUVar1,(UA_NodeId *)&respHeader.messageHeader.messageSize);
  UVar8 = UA_decodeBinary(msg,(size_t *)pUVar1,local_230,UA_TYPES + 0x61);
  if ((UVar8 == 0 && ((UVar7 == 0 && (UVar6 == 0 && UVar5 == 0)) && iVar10 == 0)) &&
     (requestType._0_4_ == 0x1be)) {
    memset(&r.requestedLifetime,0,0xb8);
    UVar4 = seqHeader;
    Service_OpenSecureChannel
              (server,(UA_Connection *)seqHeader,(UA_OpenSecureChannelRequest *)local_230,
               (UA_OpenSecureChannelResponse *)&r.requestedLifetime);
    UA_OpenSecureChannelRequest_deleteMembers((UA_OpenSecureChannelRequest *)local_230);
    lVar3 = *(long *)((long)UVar4 + 0x30);
    if (lVar3 != 0) {
      *(UA_UInt32 *)(lVar3 + 0xb8) = local_40.sequenceNumber;
      auStack_58 = (undefined1  [8])0x0;
      resp_msg.length = 0;
      iVar9 = (**(code **)((long)UVar4 + 0x58))(UVar4,*(undefined4 *)((long)UVar4 + 8));
      if (iVar9 == 0) {
        offset_00 = &asymHeader.receiverCertificateThumbprint.data;
        asymHeader.receiverCertificateThumbprint.data = (UA_Byte *)0xc;
        *(int *)(lVar3 + 0xbc) = *(int *)(lVar3 + 0xbc) + 1;
        local_40.sequenceNumber = *(UA_UInt32 *)(lVar3 + 0xbc);
        UVar5 = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary
                          ((UA_AsymmetricAlgorithmSecurityHeader *)&offset,
                           (UA_ByteString *)auStack_58,(size_t *)offset_00);
        UVar6 = UA_SequenceHeader_encodeBinary
                          (&local_40,(UA_ByteString *)auStack_58,(size_t *)offset_00);
        p.serverNonce.data._0_2_ = 0;
        stack0xffffffffffffff24 = 0x1c100000000;
        UVar7 = UA_NodeId_encodeBinary
                          ((UA_NodeId *)&p.serverNonce.data,(UA_ByteString *)auStack_58,
                           (size_t *)offset_00);
        UVar8 = UA_encodeBinary(&r.requestedLifetime,UA_TYPES + 0x54,(UA_exchangeEncodeBuffer)0x0,
                                (void *)0x0,(UA_ByteString *)auStack_58,(size_t *)offset_00);
        UVar4 = seqHeader;
        pUVar1 = asymHeader.receiverCertificateThumbprint.data;
        if (UVar8 != 0 || (UVar7 != 0 || (UVar6 != 0 || UVar5 != 0))) {
          (**(code **)((long)seqHeader + 0x60))(seqHeader,auStack_58);
          UA_OpenSecureChannelResponse_deleteMembers
                    ((UA_OpenSecureChannelResponse *)&r.requestedLifetime);
          UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                    ((UA_AsymmetricAlgorithmSecurityHeader *)&offset);
          (**(code **)((long)UVar4 + 0x80))(UVar4);
          return;
        }
        responseType.identifier._12_4_ = 0x464e504f;
        respHeader.messageHeader.messageTypeAndChunkType = p.serverProtocolVersion;
        asymHeader.receiverCertificateThumbprint.data = (UA_Byte *)0x0;
        UA_SecureConversationMessageHeader_encodeBinary
                  ((UA_SecureConversationMessageHeader *)((long)&responseType.identifier + 0xc),
                   (UA_ByteString *)auStack_58,
                   (size_t *)&asymHeader.receiverCertificateThumbprint.data);
        auStack_58 = (undefined1  [8])((ulong)pUVar1 & 0xffffffff);
        (**(code **)((long)seqHeader + 0x68))(seqHeader,(UA_ByteString *)auStack_58);
        UA_OpenSecureChannelResponse_deleteMembers
                  ((UA_OpenSecureChannelResponse *)&r.requestedLifetime);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                  ((UA_AsymmetricAlgorithmSecurityHeader *)&offset);
        return;
      }
    }
    UA_OpenSecureChannelResponse_deleteMembers((UA_OpenSecureChannelResponse *)&r.requestedLifetime)
    ;
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
              ((UA_AsymmetricAlgorithmSecurityHeader *)&offset);
    (**(code **)((long)UVar4 + 0x80))(UVar4);
  }
  else {
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
              ((UA_AsymmetricAlgorithmSecurityHeader *)&offset);
    UA_NodeId_deleteMembers((UA_NodeId *)&respHeader.messageHeader.messageSize);
    UA_OpenSecureChannelRequest_deleteMembers((UA_OpenSecureChannelRequest *)local_230);
    (**(code **)((long)seqHeader + 0x80))();
  }
  return;
}

Assistant:

static void
processOPN(UA_Server *server, UA_Connection *connection,
           UA_UInt32 channelId, const UA_ByteString *msg) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Called before HEL */
    if(connection->state != UA_CONNECTION_ESTABLISHED)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;
    /* Opening up a channel with a channelid already set */
    if(!connection->channel && channelId != 0)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;
    /* Renew a channel with the wrong channelid */
    if(connection->channel && channelId != connection->channel->securityToken.channelId)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;

    /* Decode the request */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_SequenceHeader seqHeader;
    UA_NodeId requestType;
    UA_OpenSecureChannelRequest r;
    size_t offset = 0;
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(msg, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(msg, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(msg, &offset, &requestType);
    retval |= UA_OpenSecureChannelRequest_decodeBinary(msg, &offset, &r);

    /* Error occured */
    if(retval != UA_STATUSCODE_GOOD || requestType.identifier.numeric != 446) {
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_OpenSecureChannelRequest_deleteMembers(&r);
        connection->close(connection);
        return;
    }

    /* Call the service */
    UA_OpenSecureChannelResponse p;
    UA_OpenSecureChannelResponse_init(&p);
    Service_OpenSecureChannel(server, connection, &r, &p);
    UA_OpenSecureChannelRequest_deleteMembers(&r);

    /* Opening the channel failed */
    UA_SecureChannel *channel = connection->channel;
    if(!channel) {
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Set the starting sequence number */
    channel->receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Allocate the return message */
    UA_ByteString resp_msg;
    UA_ByteString_init(&resp_msg);
    retval = connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &resp_msg);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Encode the message after the secureconversationmessageheader */
    size_t tmpPos = 12; /* skip the header */
    seqHeader.sequenceNumber = UA_atomic_add(&channel->sendSequenceNumber, 1);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &resp_msg, &tmpPos); // just mirror back
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &resp_msg, &tmpPos);
    UA_NodeId responseType = UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&responseType, &resp_msg, &tmpPos);
    retval |= UA_OpenSecureChannelResponse_encodeBinary(&p, &resp_msg, &tmpPos);

    if(retval != UA_STATUSCODE_GOOD) {
        connection->releaseSendBuffer(connection, &resp_msg);
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Encode the secureconversationmessageheader (cannot fail) and send */
    UA_SecureConversationMessageHeader respHeader;
    respHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    respHeader.messageHeader.messageSize = (UA_UInt32)tmpPos;
    respHeader.secureChannelId = p.securityToken.channelId;
    tmpPos = 0;
    UA_SecureConversationMessageHeader_encodeBinary(&respHeader, &resp_msg, &tmpPos);
    resp_msg.length = respHeader.messageHeader.messageSize;
    connection->send(connection, &resp_msg);

    /* Clean up */
    UA_OpenSecureChannelResponse_deleteMembers(&p);
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
}